

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  long *plVar1;
  atomic<int> *paVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  Geometry *pGVar6;
  BVH *pBVar7;
  MutexSys *pMVar8;
  Scene *pSVar9;
  long lVar10;
  BuildRef *pBVar11;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  PrimRef *pPVar16;
  long *plVar17;
  MutexSys *this_01;
  ulong uVar18;
  undefined8 *puVar19;
  ulong uVar20;
  ulong uVar21;
  PrimRef *pPVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  Lock<embree::MutexSys> lock;
  vuint<4> v1;
  vuint<4> geomID;
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  PrimRef *local_c0;
  vuint<4> v2;
  anon_union_16_2_9473010e_for_vuint_impl<4>_1 local_98;
  PrimInfo pinfo;
  
  sVar26 = this->objectID_;
  pGVar6 = (topBuilder->scene->geometries).items[sVar26].ptr;
  uVar24 = pGVar6->numPrimitives;
  uVar27 = CONCAT44(0,uVar24);
  lVar23 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_e0._0_8_ = lVar23 + 0x550;
  if (lVar23 == 0) {
    local_e0._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_c0 = (PrimRef *)0x0;
  local_e0[8] = false;
  local_d0 = (undefined1  [16])0x0;
  if (uVar27 != 0) {
    sVar26 = uVar27 << 5;
    (**((MemoryMonitorInterface *)local_e0._0_8_)->_vptr_MemoryMonitorInterface)
              (local_e0._0_8_,sVar26,0);
    if (uVar24 < 0xe0000) {
      local_c0 = (PrimRef *)alignedMalloc(sVar26,0x20);
    }
    else {
      local_c0 = (PrimRef *)os_malloc(sVar26,(bool *)(local_e0 + 8));
    }
    local_d0._8_4_ = uVar24;
    local_d0._0_8_ = uVar27;
    local_d0._12_4_ = 0;
    sVar26 = this->objectID_;
  }
  avx::createPrimRefArray
            (&pinfo,pGVar6,(uint)sVar26,uVar27,(mvector<PrimRef> *)local_e0,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  plVar17 = (long *)__tls_get_addr(&PTR_021f8d38);
  uVar27 = 0;
  do {
    if (pinfo.end - pinfo.begin <= uVar27) {
      uVar15 = local_d0._8_8_;
      if (local_c0 != (PrimRef *)0x0) {
        if ((ulong)(local_d0._8_8_ << 5) < 0x1c00000) {
          alignedFree(local_c0);
        }
        else {
          os_free(local_c0,local_d0._8_8_ << 5,local_e0[8]);
        }
      }
      if (uVar15 != 0) {
        (***(_func_int ***)local_e0._0_8_)(local_e0._0_8_,uVar15 * -0x20,1);
      }
      return;
    }
    pBVar7 = topBuilder->bvh;
    this_01 = (MutexSys *)*plVar17;
    if (this_01 == (MutexSys *)0x0) {
      this_01 = (MutexSys *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys(this_01);
      this_01[1].mutex = (void *)0x0;
      this_01[8].mutex = this_01;
      this_01[9].mutex = (void *)0x0;
      this_01[10].mutex = (void *)0x0;
      this_01[0xb].mutex = (void *)0x0;
      this_01[0xc].mutex = (void *)0x0;
      this_01[0xb].mutex = (void *)0x0;
      this_01[0xc].mutex = (void *)0x0;
      this_01[0xd].mutex = (void *)0x0;
      this_01[0xe].mutex = (void *)0x0;
      this_01[0x10].mutex = this_01;
      this_01[0x11].mutex = (void *)0x0;
      this_01[0x12].mutex = (void *)0x0;
      this_01[0x13].mutex = (void *)0x0;
      this_01[0x14].mutex = (void *)0x0;
      this_01[0x13].mutex = (void *)0x0;
      this_01[0x14].mutex = (void *)0x0;
      this_01[0x15].mutex = (void *)0x0;
      this_01[0x16].mutex = (void *)0x0;
      *plVar17 = (long)this_01;
      lock.locked = true;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      v1.field_0.v[0] = (longlong)this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&v1);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&v1);
      Lock<embree::MutexSys>::~Lock(&lock);
    }
    this_00 = &pBVar7->alloc;
    uVar20 = (ulong)(((pBVar7->alloc).use_single_mode ^ 1) << 6);
    geomID.field_0.v[0] = 0x50;
    pMVar8 = *(MutexSys **)((long)&this_01[8].mutex + uVar20);
    if (this_00 != (FastAllocator *)pMVar8[1].mutex) {
      v1.field_0.v[1]._0_1_ = 1;
      v1.field_0.v[0] = (longlong)pMVar8;
      MutexSys::lock(pMVar8);
      if (pMVar8[1].mutex != (void *)0x0) {
        LOCK();
        plVar1 = (long *)((long)pMVar8[1].mutex + 0x118);
        *plVar1 = *plVar1 + (long)pMVar8[0x15].mutex + (long)pMVar8[0xd].mutex;
        UNLOCK();
        LOCK();
        plVar1 = (long *)((long)pMVar8[1].mutex + 0x120);
        *plVar1 = *plVar1 + (((long)pMVar8[0xb].mutex + (long)pMVar8[0x13].mutex) -
                            ((long)pMVar8[10].mutex + (long)pMVar8[0x12].mutex));
        UNLOCK();
        LOCK();
        plVar1 = (long *)((long)pMVar8[1].mutex + 0x128);
        *plVar1 = *plVar1 + (long)pMVar8[0x16].mutex + (long)pMVar8[0xe].mutex;
        UNLOCK();
      }
      pMVar8[0xb].mutex = (void *)0x0;
      pMVar8[0xc].mutex = (void *)0x0;
      pMVar8[0xd].mutex = (void *)0x0;
      pMVar8[0xe].mutex = (void *)0x0;
      pMVar8[9].mutex = (void *)0x0;
      pMVar8[10].mutex = (void *)0x0;
      pMVar8[0xb].mutex = (void *)0x0;
      pMVar8[0xc].mutex = (void *)0x0;
      pMVar8[0xc].mutex = (void *)(pBVar7->alloc).defaultBlockSize;
      pMVar8[0x11].mutex = (void *)0x0;
      pMVar8[0x12].mutex = (void *)0x0;
      pMVar8[0x13].mutex = (void *)0x0;
      pMVar8[0x14].mutex = (void *)0x0;
      pMVar8[0x13].mutex = (void *)0x0;
      pMVar8[0x14].mutex = (void *)0x0;
      pMVar8[0x15].mutex = (void *)0x0;
      pMVar8[0x16].mutex = (void *)0x0;
      pMVar8[0x14].mutex = (void *)(pBVar7->alloc).defaultBlockSize;
      LOCK();
      pMVar8[1].mutex = this_00;
      UNLOCK();
      v2.field_0.v[0] = (longlong)pMVar8;
      lock.locked = true;
      lock.mutex = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      std::
      vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ::push_back(&(pBVar7->alloc).thread_local_allocators,(value_type *)&v2);
      Lock<embree::MutexSys>::~Lock(&lock);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&v1);
    }
    plVar1 = (long *)((long)&this_01[0xd].mutex + uVar20);
    *plVar1 = *plVar1 + geomID.field_0.v[0];
    lVar23 = *(long *)((long)&this_01[10].mutex + uVar20);
    uVar21 = (ulong)(-(int)lVar23 & 0xf);
    uVar18 = lVar23 + geomID.field_0.v[0] + uVar21;
    *(ulong *)((long)&this_01[10].mutex + uVar20) = uVar18;
    if (*(ulong *)((long)&this_01[0xb].mutex + uVar20) < uVar18) {
      *(long *)((long)&this_01[10].mutex + uVar20) = lVar23;
      pMVar8 = *(MutexSys **)((long)&this_01[0xc].mutex + uVar20);
      if (pMVar8 < (MutexSys *)(geomID.field_0.v[0] << 2)) {
        puVar19 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&geomID);
      }
      else {
        lock.mutex = pMVar8;
        puVar19 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&lock);
        *(undefined8 **)((long)&this_01[9].mutex + uVar20) = puVar19;
        lVar23 = (*(long *)((long)&this_01[0xb].mutex + uVar20) -
                 *(long *)((long)&this_01[10].mutex + uVar20)) +
                 *(long *)((long)&this_01[0xe].mutex + uVar20);
        *(long *)((long)&this_01[0xe].mutex + uVar20) = lVar23;
        *(undefined8 *)((long)&this_01[10].mutex + uVar20) = 0;
        *(MutexSys **)((long)&this_01[0xb].mutex + uVar20) = lock.mutex;
        *(longlong *)((long)&this_01[10].mutex + uVar20) = geomID.field_0.v[0];
        if (lock.mutex < (ulong)geomID.field_0.v[0]) {
          *(undefined8 *)((long)&this_01[10].mutex + uVar20) = 0;
          lock.mutex = *(MutexSys **)((long)&this_01[0xc].mutex + uVar20);
          puVar19 = (undefined8 *)FastAllocator::malloc(this_00,(size_t)&lock);
          *(undefined8 **)((long)&this_01[9].mutex + uVar20) = puVar19;
          lVar23 = (*(long *)((long)&this_01[0xb].mutex + uVar20) -
                   *(long *)((long)&this_01[10].mutex + uVar20)) +
                   *(long *)((long)&this_01[0xe].mutex + uVar20);
          *(long *)((long)&this_01[0xe].mutex + uVar20) = lVar23;
          *(undefined8 *)((long)&this_01[10].mutex + uVar20) = 0;
          *(MutexSys **)((long)&this_01[0xb].mutex + uVar20) = lock.mutex;
          *(longlong *)((long)&this_01[10].mutex + uVar20) = geomID.field_0.v[0];
          if (lock.mutex < (ulong)geomID.field_0.v[0]) {
            *(undefined8 *)((long)&this_01[10].mutex + uVar20) = 0;
            puVar19 = (undefined8 *)0x0;
            goto LAB_00da045f;
          }
        }
        *(long *)((long)&this_01[0xe].mutex + uVar20) = lVar23;
      }
    }
    else {
      plVar1 = (long *)((long)&this_01[0xe].mutex + uVar20);
      *plVar1 = *plVar1 + uVar21;
      puVar19 = (undefined8 *)
                ((uVar18 - geomID.field_0._0_8_) + *(long *)((long)&this_01[9].mutex + uVar20));
    }
LAB_00da045f:
    pPVar16 = local_c0;
    uVar20 = pinfo.end - pinfo.begin;
    pSVar9 = topBuilder->bvh->scene;
    lock.mutex = (MutexSys *)0x0;
    lock.locked = false;
    lock._9_7_ = 0;
    v1.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
    v2.field_0 = (anon_union_16_2_9473010e_for_vuint_impl<4>_1)0x0;
    geomID.field_0 =
         (anon_union_16_2_9473010e_for_vuint_impl<4>_1)
         vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
    pPVar22 = local_c0 + uVar27;
    local_98 = geomID.field_0;
    for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 4) {
      if (uVar27 < uVar20) {
        fVar4 = (pPVar22->lower).field_0.m128[3];
        *(float *)((long)&geomID.field_0 + lVar23) = fVar4;
        fVar5 = (pPVar22->upper).field_0.m128[3];
        *(float *)((long)&local_98 + lVar23) = fVar5;
        pGVar6 = (pSVar9->geometries).items[(uint)fVar4].ptr;
        lVar10 = *(long *)&pGVar6->field_0x58;
        lVar25 = (ulong)(uint)fVar5 *
                 pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
        uVar24 = *(uint *)&pGVar6[1].intersectionFilterN >> 2;
        *(uint *)((long)&lock.mutex + lVar23) = *(int *)(lVar10 + lVar25) * uVar24;
        *(uint *)((long)&v1.field_0 + lVar23) = *(int *)(lVar10 + 4 + lVar25) * uVar24;
        *(uint *)((long)&v2.field_0 + lVar23) = uVar24 * *(int *)(lVar10 + 8 + lVar25);
        uVar27 = uVar27 + 1;
      }
      else if (lVar23 != 0) {
        *(uint *)((long)&geomID.field_0 + lVar23) = geomID.field_0.i[0];
        *(undefined4 *)((long)&local_98 + lVar23) = 0xffffffff;
        uVar14 = lock.mutex._0_4_;
        *(undefined4 *)((long)&lock.mutex + lVar23) = lock.mutex._0_4_;
        *(undefined4 *)((long)&v1.field_0 + lVar23) = uVar14;
        *(undefined4 *)((long)&v2.field_0 + lVar23) = uVar14;
      }
      if (uVar27 < uVar20) {
        pPVar22 = pPVar16 + uVar27;
      }
    }
    *puVar19 = lock.mutex;
    puVar19[1] = lock._8_8_;
    puVar19[2] = v1.field_0.v[0];
    puVar19[3] = v1.field_0.v[1];
    puVar19[4] = v2.field_0.v[0];
    puVar19[5] = v2.field_0.v[1];
    puVar19[6] = geomID.field_0.v[0];
    puVar19[7] = geomID.field_0.v[1];
    puVar19[8] = local_98.v[0];
    puVar19[9] = local_98.v[1];
    aVar12 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                           field_0,ZEXT416((uint)this->objectID_),0x30);
    aVar13 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             vinsertps_avx((undefined1  [16])
                           pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                           field_0,ZEXT416(1),0x30);
    LOCK();
    paVar2 = &topBuilder->nextRef;
    iVar3 = (paVar2->super___atomic_base<int>)._M_i;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    pBVar11 = (topBuilder->refs).items;
    pBVar11[iVar3].super_PrimRef.upper.field_0 = aVar13;
    pBVar11[iVar3].super_PrimRef.lower.field_0 = aVar12;
    pBVar11[iVar3].node.ptr = (ulong)puVar19 | 9;
    pBVar11[iVar3].bounds_area = 0.0;
  } while( true );
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }